

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_buffer.cpp
# Opt level: O0

void parseArgs(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  char *arg;
  int i;
  char **argv_local;
  int argc_local;
  
  arg._4_4_ = 1;
  do {
    if (argc <= arg._4_4_) {
      return;
    }
    __s1 = argv[arg._4_4_];
    iVar1 = strcmp(__s1,"map_buffer_oes");
    if (iVar1 == 0) {
      mapMethod = MAP_BUFFER_OES;
    }
    else {
      iVar1 = strcmp(__s1,"map_buffer_range_ext");
      if (iVar1 == 0) {
        mapMethod = MAP_BUFFER_RANGE_EXT;
      }
      else {
        iVar1 = strcmp(__s1,"map_buffer_range_3_0");
        if (iVar1 != 0) {
          fprintf(_stderr,"error: unexpected arg %s\n",__s1);
          exit(1);
        }
        mapMethod = MAP_BUFFER_RANGE_3_0;
      }
    }
    arg._4_4_ = arg._4_4_ + 1;
  } while( true );
}

Assistant:

static void
parseArgs(int argc, char** argv)
{
   int i;

   for (i = 1; i < argc; ++i) {
      const char *arg = argv[i];
      if (strcmp(arg, "map_buffer_oes") == 0) {
         mapMethod = MAP_BUFFER_OES;
      } else if (strcmp(arg, "map_buffer_range_ext") == 0) {
         mapMethod = MAP_BUFFER_RANGE_EXT;
      } else if (strcmp(arg, "map_buffer_range_3_0") == 0) {
         mapMethod = MAP_BUFFER_RANGE_3_0;
      } else {
         fprintf(stderr, "error: unexpected arg %s\n", arg);
         exit(1);
      }
   }
}